

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

Alignment QStyleSheetStyle::resolveAlignment(LayoutDirection layDir,Alignment src)

{
  Int IVar1;
  Int in_ESI;
  int in_EDI;
  long in_FS_OFFSET;
  undefined3 in_stack_ffffffffffffffdc;
  AlignmentFlag other;
  undefined4 in_stack_ffffffffffffffe4;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_18;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_14;
  QFlagsStorage<Qt::AlignmentFlag> local_10;
  QFlagsStorage<Qt::AlignmentFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  other = CONCAT13(1,in_stack_ffffffffffffffdc);
  local_10.i = in_ESI;
  if (in_EDI != 0) {
    local_14.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator&
                   ((QFlags<Qt::AlignmentFlag> *)CONCAT44(in_stack_ffffffffffffffe4,in_EDI),other);
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    other = CONCAT13(IVar1 != 0,(int3)other);
  }
  if ((char)(other >> 0x18) == '\0') {
    local_18.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator&
                   ((QFlags<Qt::AlignmentFlag> *)CONCAT44(in_stack_ffffffffffffffe4,in_EDI),other);
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
    if (IVar1 == 0) {
      QFlags<Qt::AlignmentFlag>::operator&
                ((QFlags<Qt::AlignmentFlag> *)CONCAT44(in_stack_ffffffffffffffe4,in_EDI),other);
      IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffe4);
      if (IVar1 != 0) {
        QFlags<Qt::AlignmentFlag>::operator&=((QFlags<Qt::AlignmentFlag> *)&local_10,-3);
        QFlags<Qt::AlignmentFlag>::operator|=((QFlags<Qt::AlignmentFlag> *)&local_10,AlignLeading);
      }
    }
    else {
      QFlags<Qt::AlignmentFlag>::operator&=((QFlags<Qt::AlignmentFlag> *)&local_10,-2);
      QFlags<Qt::AlignmentFlag>::operator|=((QFlags<Qt::AlignmentFlag> *)&local_10,AlignRight);
    }
    QFlags<Qt::AlignmentFlag>::operator|=((QFlags<Qt::AlignmentFlag> *)&local_10,AlignAbsolute);
    local_c.i = local_10.i;
  }
  else {
    local_c.i = local_10.i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
         (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)local_c.i;
}

Assistant:

Qt::Alignment QStyleSheetStyle::resolveAlignment(Qt::LayoutDirection layDir, Qt::Alignment src)
{
    if (layDir == Qt::LeftToRight || src & Qt::AlignAbsolute)
        return src;

    if (src & Qt::AlignLeft) {
        src &= ~Qt::AlignLeft;
        src |= Qt::AlignRight;
    } else if (src & Qt::AlignRight) {
        src &= ~Qt::AlignRight;
        src |= Qt::AlignLeft;
    }
    src |= Qt::AlignAbsolute;
    return src;
}